

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoped_ptr.h
# Opt level: O0

void __thiscall MeCab::scoped_string::reset_string(scoped_string *this,string *str)

{
  long lVar1;
  char *__dest;
  char *__src;
  scoped_array<char> *in_RSI;
  char *p;
  char *p_00;
  
  lVar1 = std::__cxx11::string::size();
  __dest = (char *)operator_new__(lVar1 + 1);
  p_00 = __dest;
  __src = (char *)std::__cxx11::string::c_str();
  strcpy(__dest,__src);
  scoped_array<char>::reset(in_RSI,p_00);
  return;
}

Assistant:

void reset_string(const std::string &str) {
    char *p = new char[str.size() + 1];
    std::strcpy(p, str.c_str());
    reset(p);
  }